

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_multiple_data_objects.c
# Opt level: O0

int64_t file_skip(archive_conflict *a,void *client_data,int64_t request)

{
  read_file_data *mine;
  int64_t request_local;
  void *client_data_local;
  archive_conflict *a_local;
  
  if (*(char *)((long)client_data + 0x1c) == '\0') {
    a_local = (archive_conflict *)0x0;
  }
  else {
    a_local = (archive_conflict *)file_skip_lseek(a,client_data,request);
  }
  return (int64_t)a_local;
}

Assistant:

static int64_t
file_skip(struct archive *a, void *data, int64_t request)
{
  struct mydata *mydata = (struct mydata *)data;
  int64_t result = lseek(mydata->fd, SEEK_CUR, request);
  if (result >= 0)
    return result;
  archive_set_error(a, errno, "Error seeking in '%s'", mydata->filename);
  return -1;
}